

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O3

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  sysz_reg sVar4;
  MCOperand *pMVar5;
  ulong uVar6;
  ulong uVar7;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *O_00;
  SStream *O_01;
  int iVar8;
  char *pcVar9;
  
  uVar3 = MCInst_getOpcode(MI);
  uVar3 = *(uint *)(printInstruction_OpInfo + (ulong)uVar3 * 4);
  SStream_concat0(O,(char *)((ulong)(uVar3 & 0xfff) + 0x37a87f));
  switch(uVar3 >> 0xc & 0xf) {
  case 1:
    printOperand(MI,0,O);
    goto LAB_001bd808;
  case 2:
    printBDAddrOperand(MI,0,O);
    break;
  case 3:
    printU4ImmOperand(MI,0,O);
    break;
  case 4:
    iVar8 = 0;
    goto LAB_001bdb1d;
  case 5:
    printCond4Operand(MI,1,O);
    SStream_concat0(O,anon_var_dwarf_736e5 + 0x11);
    goto switchD_001bda8f_caseD_c;
  case 6:
    printCond4Operand(MI,2,O);
    SStream_concat0(O,anon_var_dwarf_736e5 + 0x11);
    printOperand(MI,0,O);
    break;
  case 7:
    pMVar5 = MCInst_getOperand(MI,0);
    uVar3 = MCOperand_getReg(pMVar5);
    pMVar5 = MCInst_getOperand(MI,1);
    uVar6 = MCOperand_getImm(pMVar5);
    pMVar5 = MCInst_getOperand(MI,2);
    uVar7 = MCOperand_getImm(pMVar5);
    pcVar9 = " + %lu";
    if (9 < uVar6) {
      pcVar9 = " + 0x%lx";
    }
    SStream_concat(O,pcVar9 + 3,uVar6);
    pcVar9 = "(%lu";
    if (9 < uVar7) {
      pcVar9 = "(0x%lx";
    }
    SStream_concat(O,pcVar9,uVar7);
    if (uVar3 != 0) {
      SStream_concat(O,", %%%s",
                     getRegisterName_AsmStrs +
                     *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar3 - 1) * 4));
    }
    SStream_concat0(O,")");
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
      puVar1[0] = '\x03';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      sVar4 = SystemZ_map_register(uVar3);
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e] = (uint8_t)sVar4;
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x26) = uVar7;
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x2e) = uVar6;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
      *puVar1 = *puVar1 + '\x01';
    }
    SStream_concat0(O,", ");
    goto switchD_001bdd1a_caseD_6;
  case 8:
    printCond4Operand(MI,5,O);
    SStream_concat0(O,anon_var_dwarf_736e5 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    goto switchD_001bdd1a_caseD_7;
  case 9:
    printCond4Operand(MI,3,O);
    SStream_concat0(O,anon_var_dwarf_736e5 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iVar8 = 1;
    goto LAB_001bda0d;
  case 10:
    printCond4Operand(MI,4,O);
    SStream_concat0(O,anon_var_dwarf_736e5 + 0x11);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    iVar8 = 1;
    goto LAB_001bd9b9;
  default:
    goto switchD_001bd6d2_default;
  }
  SStream_concat0(O,", ");
LAB_001bd808:
  switch(uVar3 >> 0x10 & 0xf) {
  case 1:
    printS8ImmOperand(MI,2,O);
    return;
  case 2:
    printOperand(MI,1,O);
    O_00 = extraout_RDX;
    goto LAB_001bda6d;
  case 3:
    goto switchD_001bd82a_caseD_3;
  case 4:
    goto switchD_001bd6d2_default;
  case 5:
    goto switchD_001bd82a_caseD_5;
  case 6:
    printS8ImmOperand(MI,1,O);
    break;
  case 7:
    goto switchD_001bd82a_caseD_7;
  case 8:
    printU8ImmOperand(MI,1,O);
    break;
  case 9:
    printU8ImmOperand(MI,2,O);
    return;
  case 10:
    goto switchD_001bd82a_caseD_a;
  default:
    SStream_concat0(O,", ");
    O_00 = extraout_RDX_00;
LAB_001bda6d:
    switch(uVar3 >> 0x14 & 0x1f) {
    case 1:
      printOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 2:
switchD_001bdb81_caseD_2:
        printU4ImmOperand(MI,2,O);
        goto switchD_001bda8f_caseD_11;
      case 3:
        goto switchD_001bda8f_caseD_c;
      }
switchD_001bdb81_caseD_1:
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x1b & 0xf) {
      case 1:
        iVar8 = 2;
        break;
      case 2:
        goto switchD_001bdb81_caseD_2;
      case 3:
        goto switchD_001bda8f_caseD_c;
      case 4:
        iVar8 = 4;
        goto LAB_001bddba;
      case 5:
        iVar8 = 3;
LAB_001bddba:
        printU4ImmOperand(MI,iVar8,O);
        return;
      case 6:
switchD_001bdd1a_caseD_6:
        iVar8 = 3;
        goto LAB_001bd9b9;
      case 7:
switchD_001bdd1a_caseD_7:
        iVar8 = 2;
LAB_001bd9b9:
        printBDAddrOperand(MI,iVar8,O);
        return;
      case 8:
        iVar8 = 3;
        goto LAB_001bdae5;
      case 9:
        iVar8 = 3;
        break;
      case 10:
        printU8ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU8ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        printU6ImmOperand(MI,(int)O,O_01);
        return;
      default:
        goto switchD_001bd82a_caseD_5;
      }
LAB_001bda0d:
      printOperand(MI,iVar8,O);
      return;
    case 2:
      iVar8 = 2;
      goto LAB_001bdc26;
    case 3:
switchD_001bd82a_caseD_5:
      iVar8 = 2;
LAB_001bdd31:
      printS16ImmOperand(MI,iVar8,O);
      return;
    case 4:
      printOperand(MI,1,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 5:
      iVar8 = 2;
      goto LAB_001bdc00;
    case 6:
switchD_001bd6d2_default:
      return;
    case 7:
      printS8ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 8:
      printU8ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 9:
      printBDAddrOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 10:
      printBDAddrOperand(MI,1,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 0xb:
switchD_001bd82a_caseD_3:
      iVar8 = 1;
      goto LAB_001bdb1d;
    case 0xc:
      break;
    case 0xd:
switchD_001bd82a_caseD_a:
      iVar8 = 1;
      goto LAB_001bdae5;
    case 0xe:
      printU4ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      printOperand(MI,2,O);
      switch(uVar3 >> 0x19 & 3) {
      case 0:
        goto switchD_001bd6d2_default;
      case 1:
        goto switchD_001bdb81_caseD_1;
      case 2:
        goto switchD_001bdb81_caseD_2;
      }
      break;
    case 0xf:
      iVar8 = 1;
LAB_001bdc26:
      printS32ImmOperand(MI,iVar8,O);
      return;
    case 0x10:
      iVar8 = 1;
      goto LAB_001bdd31;
    case 0x11:
      goto switchD_001bda8f_caseD_11;
    case 0x12:
      iVar8 = 1;
LAB_001bdc00:
      printU32ImmOperand(MI,iVar8,O);
      return;
    case 0x13:
      printAccessRegOperand(MI,(int)O,O_00);
      return;
    case 0x14:
switchD_001bd82a_caseD_7:
      iVar8 = 2;
      goto LAB_001bdac2;
    case 0x15:
      iVar8 = 1;
LAB_001bdac2:
      printU16ImmOperand(MI,iVar8,O);
      return;
    default:
      iVar8 = 2;
LAB_001bdae5:
      printBDXAddrOperand(MI,iVar8,O);
      return;
    }
switchD_001bda8f_caseD_c:
    iVar8 = 2;
    goto LAB_001bdb1d;
  }
switchD_001bda8f_caseD_11:
  SStream_concat0(O,", ");
  iVar8 = 3;
LAB_001bdb1d:
  printPCRelOperand(MI,iVar8,O);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}